

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O1

void __thiscall
Assimp::ComputeUVMappingProcess::Execute(ComputeUVMappingProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiTextureMapping aVar2;
  undefined8 *****pppppuVar3;
  aiMaterialProperty *paVar4;
  undefined8 uVar5;
  aiMesh *mesh;
  bool bVar6;
  int iVar7;
  int iVar8;
  Logger *pLVar9;
  char *pcVar10;
  char *pcVar11;
  undefined8 *****pppppuVar12;
  ulong uVar13;
  aiVector3D *out;
  _List_node_base *p_Var14;
  runtime_error *this_00;
  aiMaterial *this_01;
  aiVector3D *this_02;
  ulong uVar15;
  ulong uVar16;
  aiScene *paVar17;
  ulong uVar18;
  aiTextureMapping *paVar19;
  uint idx;
  list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  mappingStack;
  MappingInfo info;
  char buffer [1024];
  int local_49c;
  aiTextureMapping *local_498;
  ulong local_490;
  undefined8 ****local_488;
  undefined8 ****local_480;
  undefined8 **local_478 [2];
  aiTextureMapping local_464;
  aiVector3D aStack_460;
  int iStack_454;
  aiMaterialProperty *local_450;
  aiScene *local_448;
  aiMaterial *local_440;
  char local_438 [1032];
  
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"GenUVCoordsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_488 = (undefined8 ****)local_478;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_488,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)&local_488);
    *(undefined ***)this_00 = &PTR__runtime_error_00900168;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_488 = &local_488;
  local_478[0] = (undefined8 ***)0x0;
  local_480 = local_488;
  if (pScene->mNumMaterials != 0) {
    local_490 = 0;
    local_448 = pScene;
    do {
      pppppuVar12 = (undefined8 *****)local_488;
      paVar17 = local_448;
      while (local_448 = paVar17, pppppuVar12 != &local_488) {
        pppppuVar3 = (undefined8 *****)*pppppuVar12;
        operator_delete(pppppuVar12);
        pppppuVar12 = pppppuVar3;
        paVar17 = local_448;
      }
      local_478[0] = (undefined8 ***)0x0;
      this_01 = paVar17->mMaterials[local_490];
      local_488 = &local_488;
      local_480 = &local_488;
      if (this_01->mNumProperties != 0) {
        uVar15 = 0;
        local_440 = this_01;
        do {
          paVar4 = this_01->mProperties[uVar15];
          iVar7 = strcmp((paVar4->mKey).data,"$tex.mapping");
          if ((iVar7 == 0) && (*(aiTextureMapping *)paVar4->mData != aiTextureMapping_UV)) {
            local_498 = (aiTextureMapping *)paVar4->mData;
            bVar6 = DefaultLogger::isNullLogger();
            if (!bVar6) {
              pcVar10 = TextureTypeToString(paVar4->mSemantic);
              uVar1 = paVar4->mIndex;
              pcVar11 = MappingTypeToString(*local_498);
              snprintf(local_438,0x400,"Found non-UV mapped texture (%s,%u). Mapping type: %s",
                       pcVar10,(ulong)uVar1,pcVar11);
              pLVar9 = DefaultLogger::get();
              Logger::info(pLVar9,local_438);
            }
            this_01 = local_440;
            if (*local_498 != aiTextureMapping_OTHER) {
              aVar2 = *local_498;
              aStack_460.x = 0.0;
              aStack_460.y = 1.0;
              aStack_460.z = 0.0;
              iStack_454 = 0;
              local_464 = aVar2;
              local_450 = paVar4;
              if (local_440->mNumProperties != 0) {
                uVar18 = 0;
                do {
                  paVar4 = this_01->mProperties[uVar18];
                  iVar7 = 10;
                  if ((paVar4->mSemantic == local_450->mSemantic) &&
                     (paVar4->mIndex == local_450->mIndex)) {
                    iVar8 = strcmp((paVar4->mKey).data,"$tex.mapaxis");
                    iVar7 = 0;
                    if (iVar8 == 0) {
                      aStack_460.z = *(float *)(paVar4->mData + 8);
                      uVar5 = *(undefined8 *)paVar4->mData;
                      aStack_460.x = (float)uVar5;
                      aStack_460.y = (float)((ulong)uVar5 >> 0x20);
                      iVar7 = 8;
                    }
                  }
                } while (((iVar7 == 10) || (iVar7 == 0)) &&
                        (uVar18 = uVar18 + 1, uVar18 < this_01->mNumProperties));
              }
              local_49c = 99999999;
              pppppuVar12 = (undefined8 *****)local_488;
              if ((undefined8 *****)local_488 != &local_488) {
                do {
                  if (*(aiTextureMapping *)(pppppuVar12 + 2) == aVar2) {
                    if ((*(float *)((long)pppppuVar12 + 0x14) == aStack_460.x) &&
                       (!NAN(*(float *)((long)pppppuVar12 + 0x14)) && !NAN(aStack_460.x))) {
                      if ((*(float *)(pppppuVar12 + 3) == aStack_460.y) &&
                         (!NAN(*(float *)(pppppuVar12 + 3)) && !NAN(aStack_460.y))) {
                        if ((*(float *)((long)pppppuVar12 + 0x1c) == aStack_460.z) &&
                           (!NAN(*(float *)((long)pppppuVar12 + 0x1c)) && !NAN(aStack_460.z)))
                        break;
                      }
                    }
                  }
                  pppppuVar12 = (undefined8 *****)*pppppuVar12;
                } while (pppppuVar12 != &local_488);
              }
              paVar19 = local_498;
              if (&local_488 == pppppuVar12) {
                if (paVar17->mNumMeshes != 0) {
                  uVar18 = 0;
                  do {
                    mesh = paVar17->mMeshes[uVar18];
                    iVar7 = local_49c;
                    if (local_490 == mesh->mMaterialIndex) {
                      if (mesh->mTextureCoords[0] == (aiVector3D *)0x0) {
                        uVar16 = 0;
                        bVar6 = false;
                      }
                      else {
                        uVar16 = 0;
                        do {
                          uVar13 = uVar16;
                          if (uVar13 == 7) goto LAB_00728615;
                          uVar16 = uVar13 + 1;
                        } while (mesh->mTextureCoords[uVar13 + 1] != (aiVector3D *)0x0);
                        bVar6 = 6 < uVar13;
                      }
                      if (bVar6) {
LAB_00728615:
                        pLVar9 = DefaultLogger::get();
                        uVar16 = 0xffffffff;
                        Logger::error(pLVar9,
                                      "Unable to compute UV coordinates, no free UV slot found");
                      }
                      iVar8 = (int)uVar16;
                      iVar7 = local_49c;
                      if ((iVar8 != -1) && (uVar1 = mesh->mNumVertices, uVar1 != 0)) {
                        out = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
                        this_02 = out;
                        memset(out,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                        mesh->mTextureCoords[uVar16 & 0xffffffff] = out;
                        switch(*local_498) {
                        case aiTextureMapping_SPHERE:
                          ComputeSphereMapping
                                    ((ComputeUVMappingProcess *)this_02,mesh,&aStack_460,out);
                          break;
                        case aiTextureMapping_CYLINDER:
                          ComputeCylinderMapping
                                    ((ComputeUVMappingProcess *)this_02,mesh,&aStack_460,out);
                          break;
                        case aiTextureMapping_BOX:
                          pLVar9 = DefaultLogger::get();
                          Logger::error(pLVar9,"Mapping type currently not implemented");
                          break;
                        case aiTextureMapping_PLANE:
                          ComputePlaneMapping((ComputeUVMappingProcess *)this_02,mesh,&aStack_460,
                                              out);
                          break;
                        default:
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ComputeUVMappingProcess.cpp"
                                        ,0x1e4,
                                        "virtual void Assimp::ComputeUVMappingProcess::Execute(aiScene *)"
                                       );
                        }
                        paVar17 = local_448;
                        paVar19 = local_498;
                        iVar7 = iVar8;
                        if ((uVar18 != 0) && (local_49c != iVar8)) {
                          pLVar9 = DefaultLogger::get();
                          Logger::warn(pLVar9,
                                       "UV index mismatch. Not all meshes assigned to this material have equal numbers of UV channels. The UV index stored in  the material structure does therefore not apply for all meshes. "
                                      );
                          paVar17 = local_448;
                          paVar19 = local_498;
                        }
                      }
                    }
                    local_49c = iVar7;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < paVar17->mNumMeshes);
                }
                iStack_454 = local_49c;
                p_Var14 = (_List_node_base *)operator_new(0x28);
                this_01 = local_440;
                *(int *)&p_Var14[2]._M_next = iStack_454;
                p_Var14[1]._M_next = (_List_node_base *)CONCAT44(aStack_460.x,local_464);
                p_Var14[1]._M_prev = (_List_node_base *)CONCAT44(aStack_460.z,aStack_460.y);
                std::__detail::_List_node_base::_M_hook(p_Var14);
                local_478[0] = (undefined8 **)((long)local_478[0] + 1);
              }
              else {
                local_49c = *(int *)(pppppuVar12 + 4);
              }
              *paVar19 = aiTextureMapping_UV;
              aiMaterial::AddBinaryProperty
                        (this_01,&local_49c,4,"$tex.uvwsrc",local_450->mSemantic,local_450->mIndex,
                         aiPTI_Buffer);
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < this_01->mNumProperties);
      }
      local_490 = local_490 + 1;
    } while (local_490 < paVar17->mNumMaterials);
  }
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"GenUVCoordsProcess finished");
  pppppuVar12 = (undefined8 *****)local_488;
  while (pppppuVar12 != &local_488) {
    pppppuVar3 = (undefined8 *****)*pppppuVar12;
    operator_delete(pppppuVar12);
    pppppuVar12 = pppppuVar3;
  }
  return;
}

Assistant:

void ComputeUVMappingProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess begin");
    char buffer[1024];

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT)
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");

    std::list<MappingInfo> mappingStack;

    /*  Iterate through all materials and search for non-UV mapped textures
     */
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        mappingStack.clear();
        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)
        {
            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.mapping"))
            {
                aiTextureMapping& mapping = *((aiTextureMapping*)prop->mData);
                if (aiTextureMapping_UV != mapping)
                {
                    if (!DefaultLogger::isNullLogger())
                    {
                        ai_snprintf(buffer, 1024, "Found non-UV mapped texture (%s,%u). Mapping type: %s",
                            TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex,
                            MappingTypeToString(mapping));

                        ASSIMP_LOG_INFO(buffer);
                    }

                    if (aiTextureMapping_OTHER == mapping)
                        continue;

                    MappingInfo info (mapping);

                    // Get further properties - currently only the major axis
                    for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)
                    {
                        aiMaterialProperty* prop2 = mat->mProperties[a2];
                        if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex)
                            continue;

                        if ( !::strcmp( prop2->mKey.data, "$tex.mapaxis"))  {
                            info.axis = *((aiVector3D*)prop2->mData);
                            break;
                        }
                    }

                    unsigned int idx( 99999999 );

                    // Check whether we have this mapping mode already
                    std::list<MappingInfo>::iterator it = std::find (mappingStack.begin(),mappingStack.end(), info);
                    if (mappingStack.end() != it)
                    {
                        idx = (*it).uv;
                    }
                    else
                    {
                        /*  We have found a non-UV mapped texture. Now
                        *   we need to find all meshes using this material
                        *   that we can compute UV channels for them.
                        */
                        for (unsigned int m = 0; m < pScene->mNumMeshes;++m)
                        {
                            aiMesh* mesh = pScene->mMeshes[m];
                            unsigned int outIdx = 0;
                            if ( mesh->mMaterialIndex != i || ( outIdx = FindEmptyUVChannel(mesh) ) == UINT_MAX ||
                                !mesh->mNumVertices)
                            {
                                continue;
                            }

                            // Allocate output storage
                            aiVector3D* p = mesh->mTextureCoords[outIdx] = new aiVector3D[mesh->mNumVertices];

                            switch (mapping)
                            {
                            case aiTextureMapping_SPHERE:
                                ComputeSphereMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_CYLINDER:
                                ComputeCylinderMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_PLANE:
                                ComputePlaneMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_BOX:
                                ComputeBoxMapping(mesh,p);
                                break;
                            default:
                                ai_assert(false);
                            }
                            if (m && idx != outIdx)
                            {
                                ASSIMP_LOG_WARN("UV index mismatch. Not all meshes assigned to "
                                    "this material have equal numbers of UV channels. The UV index stored in  "
                                    "the material structure does therefore not apply for all meshes. ");
                            }
                            idx = outIdx;
                        }
                        info.uv = idx;
                        mappingStack.push_back(info);
                    }

                    // Update the material property list
                    mapping = aiTextureMapping_UV;
                    ((aiMaterial*)mat)->AddProperty(&idx,1,AI_MATKEY_UVWSRC(prop->mSemantic,prop->mIndex));
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess finished");
}